

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

uint16_t mpack_node_u16(mpack_node_t node)

{
  mpack_type_t mVar1;
  ulong uVar2;
  mpack_tree_t *pmVar3;
  
  pmVar3 = node.tree;
  if (pmVar3->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_int) || (mVar1 == mpack_type_uint)) &&
       (uVar2 = ((node.data)->value).u, uVar2 < 0x10000)) goto LAB_00105360;
    pmVar3->error = mpack_error_type;
    if (pmVar3->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar3->error_fn)(pmVar3,mpack_error_type);
      return 0;
    }
  }
  uVar2 = 0;
LAB_00105360:
  return (uint16_t)uVar2;
}

Assistant:

MPACK_INLINE uint16_t mpack_node_u16(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT16_MAX)
            return (uint16_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT16_MAX)
            return (uint16_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}